

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O0

void __thiscall QPDFCrypto_openssl::RC4_init(QPDFCrypto_openssl *this,uchar *key_data,int key_len)

{
  int iVar1;
  size_t local_38 [3];
  int local_1c;
  uchar *puStack_18;
  int key_len_local;
  uchar *key_data_local;
  QPDFCrypto_openssl *this_local;
  
  local_1c = key_len;
  puStack_18 = key_data;
  key_data_local = (uchar *)this;
  if (RC4_init(unsigned_char_const*,int)::rc4 == '\0') {
    iVar1 = __cxa_guard_acquire(&RC4_init(unsigned_char_const*,int)::rc4);
    if (iVar1 != 0) {
      RC4_init::rc4 = anon_unknown.dwarf_7381dd::RC4Loader::getRC4();
      __cxa_guard_release(&RC4_init(unsigned_char_const*,int)::rc4);
    }
  }
  iVar1 = EVP_CIPHER_CTX_reset(this->cipher_ctx);
  check_openssl(iVar1);
  if (local_1c == -1) {
    local_38[0] = strlen((char *)puStack_18);
    local_1c = QIntC::to_int<unsigned_long>(local_38);
  }
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)this->cipher_ctx,(EVP_CIPHER *)RC4_init::rc4,
                             (ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
  check_openssl(iVar1);
  iVar1 = EVP_CIPHER_CTX_set_key_length((EVP_CIPHER_CTX *)this->cipher_ctx,local_1c);
  check_openssl(iVar1);
  iVar1 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)this->cipher_ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             puStack_18,(uchar *)0x0);
  check_openssl(iVar1);
  return;
}

Assistant:

void
QPDFCrypto_openssl::RC4_init(unsigned char const* key_data, int key_len)
{
#ifdef QPDF_OPENSSL_1
    static auto const rc4 = EVP_rc4();
#else
    static auto const rc4 = RC4Loader::getRC4();
#endif
    check_openssl(EVP_CIPHER_CTX_reset(cipher_ctx));
    if (key_len == -1) {
        key_len = QIntC::to_int(strlen(reinterpret_cast<const char*>(key_data)));
    }
    check_openssl(EVP_EncryptInit_ex(cipher_ctx, rc4, nullptr, nullptr, nullptr));
    check_openssl(EVP_CIPHER_CTX_set_key_length(cipher_ctx, key_len));
    check_openssl(EVP_EncryptInit_ex(cipher_ctx, nullptr, nullptr, key_data, nullptr));
}